

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

FuncType * __thiscall wabt::Module::GetFuncType(Module *this,Var *var)

{
  pointer ppFVar1;
  Index IVar2;
  FuncType *pFVar3;
  
  IVar2 = BindingHash::FindIndex(&this->func_type_bindings,var);
  ppFVar1 = (this->func_types).
            super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->func_types).
                    super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3)) {
    pFVar3 = ppFVar1[IVar2];
  }
  else {
    pFVar3 = (FuncType *)0x0;
  }
  return pFVar3;
}

Assistant:

const FuncType* Module::GetFuncType(const Var& var) const {
  return const_cast<Module*>(this)->GetFuncType(var);
}